

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-escape.c
# Opt level: O2

_Bool borg_dimension_door(wchar_t allow_fail)

{
  _Bool _Var1;
  wchar_t wVar2;
  loc grid;
  int iVar3;
  int iVar4;
  wchar_t wVar5;
  wchar_t x;
  wchar_t y;
  wchar_t local_3c;
  uint16_t (*local_38) [19];
  
  _Var1 = borg_spell_okay_fail(DIMENSION_DOOR,allow_fail);
  if (_Var1) {
    local_38 = borg_fear_region + borg.c.y;
    wVar5 = (wchar_t)(*local_38)[borg.c.x];
    for (iVar4 = -0x32; iVar4 != 0x32; iVar4 = iVar4 + 1) {
      for (iVar3 = -0x32; iVar3 != 0x32; iVar3 = iVar3 + 1) {
        x = borg.c.x + iVar4;
        y = borg.c.y + iVar3;
        if (-1 < (x | y)) {
          grid = (loc)loc(x,y);
          _Var1 = square_in_bounds_fully(cave,grid);
          if ((_Var1) && (wVar2 = borg_danger(y,x,L'\x02',true,false), wVar2 < wVar5)) {
            local_38 = (uint16_t (*) [19])(ulong)(uint)y;
            wVar5 = wVar2;
            local_3c = x;
          }
        }
      }
    }
    if (wVar5 < (int)(uint)borg_fear_region[borg.c.y][borg.c.x]) {
      borg_target((loc_conflict)((ulong)(uint)local_3c | (long)local_38 << 0x20));
      borg_spell(DIMENSION_DOOR);
      borg_keypress(0x35);
      return true;
    }
  }
  return false;
}

Assistant:

bool borg_dimension_door(int allow_fail)
{
    int        x_off, y_off;
    int        t_x, t_y;
    struct loc best;
    int        d, best_d = 0;
    struct loc target;

    /* for now keep the range at under 50, for performance */
    int range = 50;

    /* Require ability (right now) */
    if (!borg_spell_okay_fail(DIMENSION_DOOR, allow_fail))
        return 0;

    /* if we are attacking, calculate gains, but if this is just a teleport */
    /* the current danger is the starting point */
    best_d = borg_fear_region[borg.c.y][borg.c.x];

    /* Pick a location */
    for (x_off = range * -1; x_off < range; x_off++) {
        for (y_off = range * -1; y_off < range; y_off++) {
            t_x = borg.c.x + x_off;
            t_y = borg.c.y + y_off;

            if (t_x < 0 || t_y < 0)
                continue;

            target = loc(borg.c.x + x_off, borg.c.y + y_off);

            if (!square_in_bounds_fully(cave, target))
                continue;

            d = borg_danger(t_y, t_x, 2, true, false);
            if (d < best_d) {
                best_d = d;
                best.x = t_x;
                best.y = t_y;
            }
        }
    }

    if (best_d < borg_fear_region[borg.c.y][borg.c.x]) {
        borg_target(best);

        borg_spell(DIMENSION_DOOR);

        /* pick target */
        borg_keypress('5');
        return true;
    }
    return false;
}